

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle.cpp
# Opt level: O3

uint256 * BlockMerkleRoot(uint256 *__return_storage_ptr__,CBlock *block,bool *mutated)

{
  uchar *puVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  vector<uint256,_std::allocator<uint256>_> hashes;
  pointer puVar6;
  pointer puVar7;
  long lVar8;
  pointer psVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  vector<uint256,_std::allocator<uint256>_> leaves;
  undefined8 in_stack_ffffffffffffffa8;
  pointer puVar11;
  vector<uint256,_std::allocator<uint256>_> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_38.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_38.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<uint256,_std::allocator<uint256>_>::resize
            (&local_38,
             (long)(block->vtx).
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(block->vtx).
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
  puVar7 = local_38.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  puVar6 = local_38.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar11 = local_38.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_start;
  psVar9 = (block->vtx).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((block->vtx).
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar9) {
    lVar8 = 0;
    uVar10 = 0;
    do {
      lVar2 = *(long *)((long)&(psVar9->
                               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr + lVar8);
      uVar3 = *(undefined8 *)(lVar2 + 0x39);
      uVar4 = *(undefined8 *)(lVar2 + 0x41);
      uVar5 = *(undefined8 *)(lVar2 + 0x51);
      puVar1 = ((local_38.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                 super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems +
               lVar8 * 2 + 0x10;
      *(undefined8 *)puVar1 = *(undefined8 *)(lVar2 + 0x49);
      *(undefined8 *)(puVar1 + 8) = uVar5;
      puVar1 = ((local_38.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                 super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems +
               lVar8 * 2;
      *(undefined8 *)puVar1 = uVar3;
      *(undefined8 *)(puVar1 + 8) = uVar4;
      uVar10 = uVar10 + 1;
      psVar9 = (block->vtx).
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x10;
    } while (uVar10 < (ulong)((long)(block->vtx).
                                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)psVar9 >> 4))
    ;
  }
  local_38.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_38.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_38.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_finish = puVar11;
  hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffffa8;
  hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = puVar6;
  ComputeMerkleRoot(__return_storage_ptr__,hashes,(bool *)&stack0xffffffffffffffb0);
  if (puVar11 != (pointer)0x0) {
    operator_delete(puVar11,(long)puVar7 - (long)puVar11);
  }
  if (local_38.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

uint256 BlockMerkleRoot(const CBlock& block, bool* mutated)
{
    std::vector<uint256> leaves;
    leaves.resize(block.vtx.size());
    for (size_t s = 0; s < block.vtx.size(); s++) {
        leaves[s] = block.vtx[s]->GetHash();
    }
    return ComputeMerkleRoot(std::move(leaves), mutated);
}